

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack18_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  auVar11._8_8_ = *(undefined8 *)(in + 2);
  auVar11._0_8_ = *(undefined8 *)(in + 2);
  auVar19._8_8_ = 0x60000000a;
  auVar19._0_8_ = 0x60000000a;
  uVar1 = in[1];
  auVar10 = *(undefined1 (*) [16])in;
  auVar12 = vpbroadcastq_avx512vl(ZEXT816(0x300000003fffc));
  auVar8 = vpbroadcastq_avx512vl(ZEXT816(0x80000000c));
  auVar9 = vpmovsxbd_avx512vl(ZEXT416(0x1000005));
  auVar5 = vpmovsxbd_avx(ZEXT416(0xa180614));
  uVar3 = *(ulong *)(in + 4);
  *out = *in & 0x3ffff;
  auVar7 = _DAT_00190350;
  auVar20 = _DAT_00190340;
  auVar11 = vpshufd_avx(auVar11,0x50);
  auVar18 = vpshufd_avx(auVar19,0x50);
  auVar19 = vpshufd_avx(auVar10,0xa4);
  auVar11 = vpsllvd_avx2(auVar11,auVar18);
  auVar11 = vpblendd_avx2(auVar11,ZEXT416(uVar1 << 0xe),1);
  auVar13 = vpbroadcastd_avx512vl();
  uVar4 = *(ulong *)(in + 8);
  auVar11 = vpand_avx(auVar11,_DAT_00190340);
  auVar16 = vpsrlvd_avx2(auVar10,_DAT_00190350);
  auVar11 = vpblendd_avx2(auVar11,auVar16,8);
  auVar22._8_8_ = 0x1000000002;
  auVar22._0_8_ = 0x1000000002;
  auVar15 = vpmovzxdq_avx2(auVar11);
  auVar6 = vpblendd_avx2(auVar15,auVar13,0x80);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar3;
  auVar11 = vpsllvd_avx2(auVar25,auVar22);
  auVar10 = vpalignr_avx(auVar11,auVar10,8);
  auVar15 = vpmovsxbd_avx2(ZEXT816(0x50303010100));
  auVar17._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar19;
  auVar17._16_16_ = ZEXT116(1) * auVar10;
  auVar15 = vpermd_avx2(auVar15,auVar17);
  auVar13 = vpmovsxbw_avx2(_DAT_00190380);
  auVar14 = vpandd_avx512vl(auVar17,auVar12);
  auVar17 = vpsrlvd_avx2(auVar15,auVar13);
  auVar15 = vpblendd_avx2(auVar17,auVar14,0xc0);
  auVar16._8_4_ = 0x3ffff;
  auVar16._0_8_ = 0x3ffff0003ffff;
  auVar16._12_4_ = 0x3ffff;
  auVar14._16_4_ = 0x3ffff;
  auVar14._0_16_ = auVar16;
  auVar14._20_4_ = 0x3ffff;
  auVar14._24_4_ = 0x3ffff;
  auVar14._28_4_ = 0x3ffff;
  auVar6 = vpor_avx2(auVar15,auVar6);
  auVar15 = vpand_avx2(auVar17,auVar14);
  auVar15 = vpblendd_avx2(auVar6,auVar15,0x2a);
  auVar24._8_8_ = 0x3ff000003f000;
  auVar24._0_8_ = 0x3ff000003f000;
  *(undefined1 (*) [32])(out + 1) = auVar15;
  out[9] = (uint)(uVar3 >> 0x22) & 0x3ffff;
  uVar3 = *(ulong *)(in + 6);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar3;
  auVar10 = vpsllvd_avx512vl(auVar26,auVar8);
  auVar11 = vpermt2d_avx512vl(auVar26,auVar9,auVar25);
  auVar10 = vpand_avx(auVar10,auVar24);
  auVar10 = vpmovzxdq_avx(auVar10);
  auVar19 = vpsrlvd_avx2(auVar11,auVar5);
  auVar11 = vpor_avx(auVar19,auVar10);
  auVar10 = vpand_avx(auVar19,auVar16);
  auVar10 = vpblendd_avx2(auVar11,auVar10,10);
  uVar1 = in[10];
  *(undefined1 (*) [16])(out + 10) = auVar10;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar4;
  auVar11 = vpsrld_avx(auVar10,0xe);
  auVar10 = vpand_avx(auVar10,auVar16);
  auVar10 = vpblendd_avx2(auVar11,auVar10,2);
  auVar28._8_8_ = *(undefined8 *)(in + 0xb);
  auVar28._0_8_ = *(undefined8 *)(in + 0xb);
  out[0xe] = ((uint)uVar4 & 0x3fff) << 4 | (uint)(uVar3 >> 0x3c);
  *(long *)(out + 0xf) = auVar10._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar4;
  auVar10 = vpshufd_avx(auVar27,0x55);
  auVar11 = vpinsrd_avx(auVar10,uVar1,1);
  uVar3 = *(ulong *)(in + 0xd);
  auVar10 = vpshufd_avx(auVar28,0x50);
  auVar10 = vpsllvd_avx2(auVar10,auVar18);
  auVar10 = vpblendd_avx2(auVar10,ZEXT416(uVar1 << 0xe),1);
  auVar15 = vpmovsxbd_avx2(ZEXT816(0x50808010100));
  auVar10 = vpand_avx(auVar10,auVar20);
  auVar18 = vpsrlvd_avx2(auVar28,auVar7);
  auVar10 = vpblendd_avx2(auVar10,auVar18,8);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  auVar18 = vpsllvd_avx2(auVar20,auVar22);
  auVar23._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar11;
  auVar23._16_16_ = ZEXT116(1) * auVar28;
  auVar6 = vpmovzxdq_avx2(auVar10);
  auVar21._0_8_ = auVar18._0_8_;
  auVar21._8_8_ = auVar21._0_8_;
  auVar21._16_8_ = auVar21._0_8_;
  auVar21._24_8_ = auVar21._0_8_;
  auVar12 = vpandd_avx512vl(auVar21,auVar12);
  auVar15 = vpermi2d_avx512vl(auVar15,auVar23,ZEXT1632(auVar28));
  auVar17 = vpsrlvd_avx2(auVar15,auVar13);
  auVar13 = vpbroadcastd_avx512vl();
  uVar2 = in[0x11];
  auVar15 = vpblendd_avx2(auVar17,auVar12,0xc0);
  auVar13 = vpblendd_avx2(auVar6,auVar13,0x80);
  auVar13 = vpor_avx2(auVar15,auVar13);
  auVar15 = vpand_avx2(auVar17,auVar14);
  auVar15 = vpblendd_avx2(auVar13,auVar15,0x2a);
  *(undefined1 (*) [32])(out + 0x11) = auVar15;
  out[0x19] = (uint)(uVar3 >> 0x22) & 0x3ffff;
  uVar3 = *(ulong *)(in + 0xf);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar3;
  auVar10 = vpsllvd_avx512vl(auVar18,auVar8);
  auVar11 = vpermt2d_avx512vl(auVar18,auVar9,auVar20);
  auVar10 = vpand_avx(auVar24,auVar10);
  auVar10 = vpmovzxdq_avx(auVar10);
  auVar5 = vpsrlvd_avx2(auVar11,auVar5);
  auVar11 = vpor_avx(auVar5,auVar10);
  auVar10 = vpand_avx(auVar5,auVar16);
  auVar10 = vpblendd_avx2(auVar11,auVar10,10);
  *(undefined1 (*) [16])(out + 0x1a) = auVar10;
  out[0x1e] = (uint)(uVar3 >> 0x3c) | (uVar2 & 0x3fff) << 4;
  out[0x1f] = uVar2 >> 0xe;
  return in + 0x12;
}

Assistant:

const uint32_t *__fastunpack18_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 2)) << (18 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 18);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 6)) << (18 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 18);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 10)) << (18 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 18);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 14)) << (18 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 4)) << (18 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 18);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 8)) << (18 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 18);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 12)) << (18 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 18);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 16)) << (18 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 2)) << (18 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 18);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 6)) << (18 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 18);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 10)) << (18 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 18);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 14)) << (18 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  out++;

  return in;
}